

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_bitonic_sort_6(int **dst)

{
  int *piVar1;
  int *_sort_swap_temp_11;
  int *_sort_swap_temp_10;
  int *_sort_swap_temp_9;
  int *_sort_swap_temp_8;
  int *_sort_swap_temp_7;
  int *_sort_swap_temp_6;
  int *_sort_swap_temp_5;
  int *_sort_swap_temp_4;
  int *_sort_swap_temp_3;
  int *_sort_swap_temp_2;
  int *_sort_swap_temp_1;
  int *_sort_swap_temp;
  int **dst_local;
  
  if (0 < *dst[1] - *dst[2]) {
    piVar1 = dst[1];
    dst[1] = dst[2];
    dst[2] = piVar1;
  }
  if (0 < *dst[4] - *dst[5]) {
    piVar1 = dst[4];
    dst[4] = dst[5];
    dst[5] = piVar1;
  }
  if (0 < **dst - *dst[2]) {
    piVar1 = *dst;
    *dst = dst[2];
    dst[2] = piVar1;
  }
  if (0 < *dst[3] - *dst[5]) {
    piVar1 = dst[3];
    dst[3] = dst[5];
    dst[5] = piVar1;
  }
  if (0 < **dst - *dst[1]) {
    piVar1 = *dst;
    *dst = dst[1];
    dst[1] = piVar1;
  }
  if (0 < *dst[3] - *dst[4]) {
    piVar1 = dst[3];
    dst[3] = dst[4];
    dst[4] = piVar1;
  }
  if (0 < *dst[2] - *dst[5]) {
    piVar1 = dst[2];
    dst[2] = dst[5];
    dst[5] = piVar1;
  }
  if (0 < **dst - *dst[3]) {
    piVar1 = *dst;
    *dst = dst[3];
    dst[3] = piVar1;
  }
  if (0 < *dst[1] - *dst[4]) {
    piVar1 = dst[1];
    dst[1] = dst[4];
    dst[4] = piVar1;
  }
  if (0 < *dst[2] - *dst[4]) {
    piVar1 = dst[2];
    dst[2] = dst[4];
    dst[4] = piVar1;
  }
  if (0 < *dst[1] - *dst[3]) {
    piVar1 = dst[1];
    dst[1] = dst[3];
    dst[3] = piVar1;
  }
  if (0 < *dst[2] - *dst[3]) {
    piVar1 = dst[2];
    dst[2] = dst[3];
    dst[3] = piVar1;
  }
  return;
}

Assistant:

static __inline void BITONIC_SORT_6(SORT_TYPE *dst) {
  SORT_CSWAP(dst[1], dst[2]);
  SORT_CSWAP(dst[4], dst[5]);
  SORT_CSWAP(dst[0], dst[2]);
  SORT_CSWAP(dst[3], dst[5]);
  SORT_CSWAP(dst[0], dst[1]);
  SORT_CSWAP(dst[3], dst[4]);
  SORT_CSWAP(dst[2], dst[5]);
  SORT_CSWAP(dst[0], dst[3]);
  SORT_CSWAP(dst[1], dst[4]);
  SORT_CSWAP(dst[2], dst[4]);
  SORT_CSWAP(dst[1], dst[3]);
  SORT_CSWAP(dst[2], dst[3]);
}